

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.h
# Opt level: O1

void __thiscall
embree::CommandLineParser::
CommandLineOptionClosure<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/tutorials/common/tutorial/tutorial.cpp:393:32)>
::parse(CommandLineOptionClosure<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_common_tutorial_tutorial_cpp:393:32)>
        *this,Ref<embree::ParseStream> *cin,FileName *path)

{
  ParseStream *this_00;
  SceneLoadingTutorialApplication *pSVar1;
  uint uVar2;
  uint uVar3;
  
  this_00 = cin->ptr;
  if (this_00 != (ParseStream *)0x0) {
    (*(this_00->
      super_Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ).super_RefCount._vptr_RefCount[2])(this_00);
  }
  pSVar1 = (this->f).this;
  uVar2 = ParseStream::getInt(this_00);
  if ((int)uVar2 < 3) {
    uVar2 = 2;
  }
  if (0x7ffe < (int)uVar2) {
    uVar2 = 0x7fff;
  }
  pSVar1->grid_resX = uVar2;
  uVar3 = ParseStream::getInt(this_00);
  uVar2 = 2;
  if (2 < (int)uVar3) {
    uVar2 = uVar3;
  }
  if (0x7ffe < (int)uVar2) {
    uVar2 = 0x7fff;
  }
  pSVar1->grid_resY = uVar2;
  (*(this_00->
    super_Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>).
    super_RefCount._vptr_RefCount[3])(this_00);
  return;
}

Assistant:

virtual void parse(Ref<ParseStream> cin, const FileName& path) {
        f(cin,path);
      }